

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::assignPosition
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,TIntermTyped *left,
          TIntermTyped *right)

{
  TIntermediate *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  TVariable *variable;
  undefined4 extraout_var_00;
  TQualifier *this_00;
  TIntermSymbol *pTVar4;
  TIntermTyped *pTVar5;
  TIntermAggregate *pTVar6;
  TIntermSymbol *base;
  TIntermConstantUnion *index_00;
  undefined4 extraout_var_01;
  TIntermTyped *right_00;
  TIntermTyped *rhsTempSym_1;
  TIntermTyped *yNeg;
  TType derefType;
  TIntermTyped *rhsElement;
  TIntermTyped *lhsElement;
  TIntermTyped *index;
  TIntermTyped *tempSymR;
  TIntermTyped *tempSymL;
  int Y;
  TIntermTyped *rhsTempSym;
  TVariable *rhsTempVar;
  TIntermAggregate *assignList;
  TIntermTyped *right_local;
  TIntermTyped *left_local;
  TOperator op_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  bVar2 = TIntermediate::getInvertY
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate);
  if (bVar2) {
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    variable = makeInternalVariable(this,"@position",(TType *)CONCAT44(extraout_var,iVar3));
    iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
    this_00 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x50))();
    TQualifier::makeTemporary(this_00);
    pTVar4 = TIntermediate::addSymbol
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,
                        loc);
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar5 = TIntermediate::addAssign
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpAssign,
                        &pTVar4->super_TIntermTyped,right,loc);
    pTVar6 = TIntermediate::growAggregate(pTVar1,(TIntermNode *)0x0,&pTVar5->super_TIntermNode,loc);
    pTVar4 = TIntermediate::addSymbol
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,
                        loc);
    base = TIntermediate::addSymbol
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,loc
                     );
    index_00 = TIntermediate::addConstantUnion
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,1,loc,
                          false);
    pTVar5 = TIntermediate::addIndex
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                        EOpIndexDirect,&pTVar4->super_TIntermTyped,&index_00->super_TIntermTyped,loc
                       );
    derefType.spirvType =
         (TSpirvType *)
         TIntermediate::addIndex
                   ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpIndexDirect
                    ,&base->super_TIntermTyped,&index_00->super_TIntermTyped,loc);
    iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    TType::TType((TType *)&yNeg,(TType *)CONCAT44(extraout_var_01,iVar3),0,false);
    (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar5,&yNeg);
    (*(code *)((derefType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.allocator[2].
              freeList)(derefType.spirvType,&yNeg);
    right_00 = TIntermediate::addUnaryMath
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          EOpNegative,(TIntermTyped *)derefType.spirvType,loc);
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar5 = TIntermediate::addAssign
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpAssign,
                        pTVar5,right_00,loc);
    pTVar6 = TIntermediate::growAggregate(pTVar1,(TIntermNode *)pTVar6,&pTVar5->super_TIntermNode);
    TType::~TType((TType *)&yNeg);
    pTVar4 = TIntermediate::addSymbol
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,
                        loc);
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar5 = TIntermediate::addAssign
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,left,
                        &pTVar4->super_TIntermTyped,loc);
    this_local = (HlslParseContext *)
                 TIntermediate::growAggregate
                           (pTVar1,(TIntermNode *)pTVar6,&pTVar5->super_TIntermNode);
    if (this_local == (HlslParseContext *)0x0) {
      __assert_fail("assignList != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xa1e,
                    "TIntermTyped *glslang::HlslParseContext::assignPosition(const TSourceLoc &, TOperator, TIntermTyped *, TIntermTyped *)"
                   );
    }
    (*((TIntermNode *)
      &(this_local->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions)->
      _vptr_TIntermNode[0x31])(this_local,1);
  }
  else {
    this_local = (HlslParseContext *)
                 TIntermediate::addAssign
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,
                            left,right,loc);
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::assignPosition(const TSourceLoc& loc, TOperator op,
                                               TIntermTyped* left, TIntermTyped* right)
{
    // If we are not asked for Y inversion, use a plain old assign.
    if (!intermediate.getInvertY())
        return intermediate.addAssign(op, left, right, loc);

    // If we get here, we should invert Y.
    TIntermAggregate* assignList = nullptr;

    // If this is a complex rvalue, we don't want to dereference it many times.  Create a temporary.
    TVariable* rhsTempVar = nullptr;
    rhsTempVar = makeInternalVariable("@position", right->getType());
    rhsTempVar->getWritableType().getQualifier().makeTemporary();

    {
        TIntermTyped* rhsTempSym = intermediate.addSymbol(*rhsTempVar, loc);
        assignList = intermediate.growAggregate(assignList,
                                                intermediate.addAssign(EOpAssign, rhsTempSym, right, loc), loc);
    }

    // pos.y = -pos.y
    {
        const int Y = 1;

        TIntermTyped* tempSymL = intermediate.addSymbol(*rhsTempVar, loc);
        TIntermTyped* tempSymR = intermediate.addSymbol(*rhsTempVar, loc);
        TIntermTyped* index = intermediate.addConstantUnion(Y, loc);

        TIntermTyped* lhsElement = intermediate.addIndex(EOpIndexDirect, tempSymL, index, loc);
        TIntermTyped* rhsElement = intermediate.addIndex(EOpIndexDirect, tempSymR, index, loc);

        const TType derefType(right->getType(), 0);

        lhsElement->setType(derefType);
        rhsElement->setType(derefType);

        TIntermTyped* yNeg = intermediate.addUnaryMath(EOpNegative, rhsElement, loc);

        assignList = intermediate.growAggregate(assignList, intermediate.addAssign(EOpAssign, lhsElement, yNeg, loc));
    }

    // Assign the rhs temp (now with Y inversion) to the final output
    {
        TIntermTyped* rhsTempSym = intermediate.addSymbol(*rhsTempVar, loc);
        assignList = intermediate.growAggregate(assignList, intermediate.addAssign(op, left, rhsTempSym, loc));
    }

    assert(assignList != nullptr);
    assignList->setOperator(EOpSequence);

    return assignList;
}